

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_a8;
  size_type *local_88;
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24 [2];
  int number_local;
  
  local_88 = &file._M_string_length;
  file._M_dataplus._M_p = (pointer)0x0;
  file._M_string_length._0_1_ = 0;
  local_24[0] = number;
  if (number == 0) {
    std::operator+(&local_48,&base_name->pathname_,".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file.field_2 + 8),&local_48,extension);
    std::__cxx11::string::operator=((string *)&local_88,(string *)(file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    this = &local_48;
  }
  else {
    std::operator+(&local_e8,&base_name->pathname_,"_");
    StreamableToString<int>(&local_c8,local_24);
    std::operator+(&local_108,&local_e8,&local_c8);
    std::operator+(&local_48,&local_108,".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&file.field_2 + 8),&local_48,extension);
    std::__cxx11::string::operator=((string *)&local_88,(string *)(file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_c8);
    this = &local_e8;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_88);
  FilePath((FilePath *)((long)&file.field_2 + 8),&local_a8);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)((long)&file.field_2 + 8));
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}